

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

bool __thiscall asl::HttpMessage::putFile(HttpMessage *this,String *path,int begin,int end)

{
  bool bVar1;
  int iVar2;
  Long LVar3;
  ULong UVar4;
  undefined4 in_register_0000000c;
  size_t sVar5;
  void *__buf;
  undefined8 uVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  String boundary;
  String head;
  String s_2;
  String s_1;
  String s;
  File file;
  undefined1 local_150 [24];
  String local_138;
  Date local_120;
  String local_118;
  String local_100;
  String local_e8;
  String local_d0;
  int local_b4;
  String local_b0;
  String local_98;
  String *local_80;
  File local_78;
  
  sVar5 = CONCAT44(in_register_0000000c,end);
  local_120._t = (double)this;
  File::File(&local_78,path);
  local_78._info.size = -1;
  File::creationDate((File *)local_150);
  if (((double)local_150._0_8_ != 0.0) || (NAN((double)local_150._0_8_))) {
    if (end == 0 && begin == 0) {
      String::String((String *)local_150,"Content-Range");
      bVar1 = hasHeader((HttpMessage *)local_120._t,(String *)local_150);
      if (local_150._0_4_ != 0) {
        free((void *)CONCAT71(local_150._9_7_,local_150[8]));
      }
      if (bVar1) goto LAB_00124d5e;
      String::String((String *)local_150,"Content-Length");
      LVar3 = File::size(&local_78);
      String::String(&local_138,LVar3);
      setHeader((HttpMessage *)local_120._t,(String *)local_150,&local_138);
    }
    else {
LAB_00124d5e:
      LVar3 = File::size(&local_78);
      if (end == 0) {
        end = (int)LVar3 - 1;
      }
      if ((begin < 0 || (end - begin == 0 || end < begin)) || LVar3 < end) {
        String::String((String *)local_150,"Content-Length");
        String::String(&local_138,"0");
        setHeader((HttpMessage *)local_120._t,(String *)local_150,&local_138);
        if (local_138._size != 0) {
          free(local_138.field_2._str);
        }
        if (local_150._0_4_ != 0) {
          free((void *)CONCAT71(local_150._9_7_,local_150[8]));
        }
        String::String((String *)local_150,"Content-Range");
        String::f(&local_138,"bytes */%lli",LVar3);
        setHeader((HttpMessage *)local_120._t,(String *)local_150,&local_138);
        if (local_138._size != 0) {
          free(local_138.field_2._str);
        }
        if (local_150._0_4_ != 0) {
          free((void *)CONCAT71(local_150._9_7_,local_150[8]));
        }
        goto LAB_00124f30;
      }
      String::String((String *)local_150,"Content-Length");
      String::String(&local_138,(end - begin) + 1);
      setHeader((HttpMessage *)local_120._t,(String *)local_150,&local_138);
      if (local_138._size != 0) {
        free(local_138.field_2._str);
      }
      if (local_150._0_4_ != 0) {
        free((void *)CONCAT71(local_150._9_7_,local_150[8]));
      }
      String::String((String *)local_150,"Content-Range");
      String::f(&local_138,"bytes %i-%i/%lli",(ulong)(uint)begin,(ulong)(uint)end,LVar3);
      setHeader((HttpMessage *)local_120._t,(String *)local_150,&local_138);
    }
    if (local_138._size != 0) {
      free(local_138.field_2._str);
    }
    if (local_150._0_4_ != 0) {
      free((void *)CONCAT71(local_150._9_7_,local_150[8]));
    }
    String::String(&local_138,"Content-Type");
    local_80 = path;
    header((String *)local_150,(HttpMessage *)local_120._t,&local_138);
    pcVar9 = (char *)CONCAT71(local_150._9_7_,local_150[8]);
    pcVar8 = pcVar9;
    if (local_150._0_4_ == 0) {
      pcVar8 = local_150 + 8;
    }
    iVar2 = strcmp(pcVar8,"multipart/form-data");
    if (local_150._0_4_ != 0) {
      free(pcVar9);
    }
    if (local_138._size != 0) {
      free(local_138.field_2._str);
    }
    local_150[8] = '\0';
    local_150._0_8_ = (FILE *)0x0;
    if (iVar2 == 0) {
      String::assign((String *)local_150,"-----------",0xb);
      iVar10 = 0x40;
      do {
        UVar4 = Random::getLong((Random *)random);
        String::operator+=((String *)local_150,
                           (char)(int)((double)(UVar4 >> 0xb) * 1.1102230246251565e-15 + 48.0));
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      String::String(&local_98,"--");
      pcVar9 = local_150 + 8;
      pcVar8 = pcVar9;
      if (local_150._0_4_ != 0) {
        pcVar8 = (char *)CONCAT71(local_150._9_7_,local_150[8]);
      }
      local_b4 = begin;
      String::append(&local_98,pcVar8,local_150._4_4_);
      String::concat(&local_d0,&local_98,"\r\n",2);
      String::concat(&local_e8,&local_d0,
                     "Content-Disposition: form-data; name=\"files\"; filename=\"",0x38);
      File::name(&local_b0,&local_78);
      uVar6 = local_b0.field_2._str;
      if (local_b0._size == 0) {
        uVar6 = &local_b0.field_2;
      }
      String::concat(&local_100,&local_e8,(char *)uVar6,local_b0._len);
      String::concat(&local_118,&local_100,"\"\r\n",3);
      String::concat(&local_138,&local_118,"Content-Type: application/octet-stream\r\n\r\n",0x2a);
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
      if (local_100._size != 0) {
        free(local_100.field_2._str);
      }
      if (local_b0._size != 0) {
        free(local_b0.field_2._str);
      }
      if (local_e8._size != 0) {
        free(local_e8.field_2._str);
      }
      if (local_d0._size != 0) {
        free(local_d0.field_2._str);
      }
      if (local_98._size != 0) {
        free(local_98.field_2._str);
      }
      String::String(&local_118,"Content-Length");
      String::String(&local_d0,"Content-Length");
      header(&local_e8,(HttpMessage *)local_120._t,&local_d0);
      uVar6 = local_e8.field_2._str;
      if (local_e8._size == 0) {
        uVar6 = &local_e8.field_2;
      }
      iVar10 = myatoi((char *)uVar6);
      sVar5 = (size_t)(uint)local_150._4_4_;
      String::String(&local_100,local_150._4_4_ + iVar10 + local_138._len + 8);
      setHeader((HttpMessage *)local_120._t,&local_118,&local_100);
      if (local_100._size != 0) {
        free(local_100.field_2._str);
      }
      if (local_e8._size != 0) {
        free(local_e8.field_2._str);
      }
      if (local_d0._size != 0) {
        free(local_d0.field_2._str);
      }
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
      String::String(&local_118,"Content-Type");
      String::String(&local_100,"multipart/form-data; boundary=");
      if (local_150._0_4_ != 0) {
        pcVar9 = (char *)CONCAT71(local_150._9_7_,local_150[8]);
      }
      String::append(&local_100,pcVar9,local_150._4_4_);
      setHeader((HttpMessage *)local_120._t,&local_118,&local_100);
      if (local_100._size != 0) {
        free(local_100.field_2._str);
      }
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
      if (local_138._size == 0) {
        iVar10 = (int)&local_138 + 8;
      }
      else {
        iVar10 = (int)local_138.field_2._str;
      }
      write((HttpMessage *)local_120._t,iVar10,(void *)(ulong)(uint)local_138._len,sVar5);
      begin = local_b4;
      if (local_138._size != 0) {
        free(local_138.field_2._str);
        begin = local_b4;
      }
    }
    pcVar9 = local_150 + 8;
    writeFile((HttpMessage *)local_120._t,local_80,begin,end);
    if (iVar2 == 0) {
      String::String(&local_118,"\r\n--");
      if (local_150._0_4_ != 0) {
        pcVar9 = (char *)CONCAT71(local_150._9_7_,local_150[8]);
      }
      String::append(&local_118,pcVar9,local_150._4_4_);
      sVar5 = 4;
      String::concat(&local_138,&local_118,"--\r\n",4);
      if (local_138._size == 0) {
        iVar2 = (int)&local_138 + 8;
      }
      else {
        iVar2 = (int)local_138.field_2._str;
      }
      write((HttpMessage *)local_120._t,iVar2,(void *)(ulong)(uint)local_138._len,sVar5);
      if (local_138._size != 0) {
        free(local_138.field_2._str);
      }
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
    }
    if (local_150._0_4_ != 0) {
      free((void *)CONCAT71(local_150._9_7_,local_150[8]));
    }
    bVar1 = true;
  }
  else {
    if (path->_size == 0) {
      paVar7 = &path->field_2;
    }
    else {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(path->field_2)._str;
    }
    printf("file to upload not found %s\n",paVar7);
    iVar2 = 0x1411b7;
    put((HttpMessage *)local_120._t,"");
    write((HttpMessage *)local_120._t,iVar2,__buf,sVar5);
LAB_00124f30:
    bVar1 = false;
  }
  File::~File(&local_78);
  return bVar1;
}

Assistant:

bool HttpMessage::putFile(const String& path, int begin, int end)
{
	File file(path);
	if (!file.exists())
	{
		printf("file to upload not found %s\n", *path);
		put("");
		write();
		return false;
	}
	if (begin == 0 && end == 0 && !hasHeader("Content-Range"))
		setHeader("Content-Length", file.size());
	else
	{
		Long size = file.size();
		if (end == 0)
			end = int(size - 1);
		if (end <= begin || begin < 0 || end > size)
		{
			setHeader("Content-Length", "0");
			setHeader("Content-Range", String::f("bytes */%lli", size));
			return false;
		}
		setHeader("Content-Length", end - begin + 1);
		setHeader("Content-Range", String::f("bytes %i-%i/%lli", begin, end, size));
	}

	bool multipart = header("Content-Type") == "multipart/form-data";

	String boundary;

	if (multipart)
	{
		boundary = "-----------";
		for (int i = 0; i < 64; i++)
			boundary += (char)random('0', '9');

		String head = "--" + boundary + "\r\n" +
			"Content-Disposition: form-data; name=\"files\"; filename=\"" + file.name() + "\"\r\n" +
			"Content-Type: application/octet-stream\r\n\r\n";

		setHeader("Content-Length", int(header("Content-Length")) + head.length() + boundary.length() + 8);
		setHeader("Content-Type", "multipart/form-data; boundary=" + boundary);

		write(head);
	}
	writeFile(path, begin, end);
	
	if (multipart)
	{
		write("\r\n--" + boundary + "--\r\n");
	}

	return true;
}